

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * getupvalname(CallInfo *ci,TValue *o,char **name)

{
  lua_CFunction p_Var1;
  char *pcVar2;
  int local_34;
  int i;
  LClosure *c;
  char **name_local;
  TValue *o_local;
  CallInfo *ci_local;
  
  p_Var1 = (ci->func->value_).f;
  local_34 = 0;
  while( true ) {
    if ((int)(uint)(byte)p_Var1[10] <= local_34) {
      return (char *)0x0;
    }
    if ((TValue *)**(long **)(p_Var1 + (long)local_34 * 8 + 0x20) == o) break;
    local_34 = local_34 + 1;
  }
  pcVar2 = upvalname(*(Proto **)(p_Var1 + 0x18),local_34);
  *name = pcVar2;
  return "upvalue";
}

Assistant:

static const char *getupvalname (CallInfo *ci, const TValue *o,
                                 const char **name) {
  LClosure *c = ci_func(ci);
  int i;
  for (i = 0; i < c->nupvalues; i++) {
    if (c->upvals[i]->v == o) {
      *name = upvalname(c->p, i);
      return "upvalue";
    }
  }
  return NULL;
}